

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O0

void boost::throw_exception<std::ios_base::failure[abi:cxx11]>(failure *e)

{
  error_info_injector<std::ios_base::failure> *x;
  undefined1 auVar1 [16];
  type local_58;
  failure *local_10;
  failure *e_local;
  
  local_10 = e;
  throw_exception_assert_compatibility((exception *)e);
  auVar1 = __cxa_allocate_exception(0x50);
  enable_error_info<std::ios_base::failure[abi:cxx11]>(&local_58,(boost *)local_10,auVar1._8_8_);
  enable_current_exception<boost::exception_detail::error_info_injector<std::ios_base::failure[abi:cxx11]>>
            (auVar1._0_8_,(boost *)&local_58,x);
  __cxa_throw(auVar1._0_8_,
              &exception_detail::
               clone_impl<boost::exception_detail::error_info_injector<std::ios_base::failure[abi:cxx11]>>
               ::typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<std::ios_base::failure>_>::
              ~clone_impl);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}